

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::SolveContactSystemRangeSpaceSparse
               (Model *model,MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,
               VectorNd *lambda,MatrixNd *K,VectorNd *a,LinearSolver linear_solver)

{
  Index IVar1;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *other;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar2;
  Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar3;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar4;
  VectorNd z;
  VectorNd Y_col;
  uint i;
  MatrixNd Y;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffdb8;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffdc8;
  SolverBase<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_> *in_stack_fffffffffffffdd0;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffde0;
  MatrixNd *in_stack_fffffffffffffde8;
  Model *in_stack_fffffffffffffdf0;
  MatrixNd *in_stack_fffffffffffffdf8;
  Model *in_stack_fffffffffffffe00;
  undefined4 local_54;
  
  Math::SparseFactorizeLTL(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_stack_fffffffffffffdb8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdd0,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffdc8
            );
  local_54 = 0;
  while( true ) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14ca6c);
    if (IVar1 <= (long)(ulong)local_54) break;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14caa1);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe00,
               (Index)in_stack_fffffffffffffdf8,(Index)in_stack_fffffffffffffdf0,
               (long)in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffdc0,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               in_stack_fffffffffffffdb8);
    Math::SparseSolveLTx
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (VectorNd *)in_stack_fffffffffffffde0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14cb1e);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe00,
               (Index)in_stack_fffffffffffffdf8,(Index)in_stack_fffffffffffffdf0,
               (long)in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffdc0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffdb8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x14cb68);
    local_54 = local_54 + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffdc0,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffdb8);
  Math::SparseSolveLTx
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (VectorNd *)in_stack_fffffffffffffde0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffdc0,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffdb8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffdc0->m_matrix,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_fffffffffffffdb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_stack_fffffffffffffdb8);
  PVar2 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffffdc0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar2.m_rhs,
             in_stack_fffffffffffffde0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffdc0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
              *)in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::llt(in_stack_fffffffffffffdc8);
  SVar3 = Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>>::
          solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (in_stack_fffffffffffffdd0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffdc8);
  other = SVar3.m_dec;
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffdc0,
             (DenseBase<Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffdb8);
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LLT(in_stack_fffffffffffffdc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(in_stack_fffffffffffffdb8);
  PVar4 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>>::operator*
                    ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)in_stack_fffffffffffffdc0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar2.m_rhs,
             (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)other);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)PVar4.m_lhs.m_matrix.m_matrix,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
              *)PVar4.m_rhs);
  Math::SparseSolveLTx
            ((Model *)PVar2.m_lhs.m_matrix.m_matrix,(MatrixNd *)PVar2.m_rhs,(VectorNd *)other);
  Math::SparseSolveLx((Model *)PVar2.m_lhs.m_matrix.m_matrix,(MatrixNd *)PVar2.m_rhs,
                      (VectorNd *)other);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x14ce5d);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14ce6a);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveContactSystemRangeSpaceSparse (
		Model &model, 
		Math::MatrixNd &H, 
		const Math::MatrixNd &G, 
		const Math::VectorNd &c, 
		const Math::VectorNd &gamma, 
		Math::VectorNd &qddot, 
		Math::VectorNd &lambda, 
		Math::MatrixNd &K, 
		Math::VectorNd &a,
		Math::LinearSolver linear_solver
	) {
	SparseFactorizeLTL (model, H);

	MatrixNd Y (G.transpose());

	for (unsigned int i = 0; i < Y.cols(); i++) {
		VectorNd Y_col = Y.block(0,i,Y.rows(),1);
		SparseSolveLTx (model, H, Y_col);
		Y.block(0,i,Y.rows(),1) = Y_col;
	}

	VectorNd z (c);
	SparseSolveLTx (model, H, z);

	K = Y.transpose() * Y;

	a = gamma - Y.transpose() * z;

	lambda = K.llt().solve(a);

	qddot = c + G.transpose() * lambda;
	SparseSolveLTx (model, H, qddot);
	SparseSolveLx (model, H, qddot);
}